

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

addrinfo * evutil_new_addrinfo_(sockaddr *sa,socklen_t socklen,addrinfo *hints)

{
  addrinfo *paVar1;
  addrinfo *paVar2;
  addrinfo tmp;
  
  if (hints == (addrinfo *)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
               ,0x340,"hints","evutil_new_addrinfo_");
  }
  if ((hints->ai_socktype == 0) && (hints->ai_protocol == 0)) {
    tmp.ai_flags = hints->ai_flags;
    tmp.ai_family = hints->ai_family;
    tmp.ai_addrlen = hints->ai_addrlen;
    tmp._20_4_ = *(undefined4 *)&hints->field_0x14;
    tmp.ai_addr = hints->ai_addr;
    tmp.ai_canonname = hints->ai_canonname;
    tmp.ai_next = hints->ai_next;
    tmp.ai_socktype = 1;
    tmp.ai_protocol = 6;
    paVar1 = evutil_new_addrinfo_(sa,socklen,&tmp);
    if (paVar1 != (addrinfo *)0x0) {
      tmp.ai_socktype = 2;
      tmp.ai_protocol = 0x11;
      paVar2 = evutil_new_addrinfo_(sa,socklen,&tmp);
      if (paVar2 != (addrinfo *)0x0) {
        paVar1->ai_next = paVar2;
        return paVar1;
      }
      evutil_freeaddrinfo(paVar1);
    }
  }
  else {
    paVar1 = (addrinfo *)event_mm_calloc_(1,(ulong)socklen + 0x30);
    if (paVar1 != (addrinfo *)0x0) {
      paVar1->ai_addr = (sockaddr *)(paVar1 + 1);
      memcpy(paVar1 + 1,sa,(ulong)socklen);
      paVar1->ai_addrlen = socklen;
      paVar1->ai_family = (uint)sa->sa_family;
      paVar1->ai_flags = -0x80000000;
      paVar1->ai_socktype = hints->ai_socktype;
      paVar1->ai_protocol = hints->ai_protocol;
      return paVar1;
    }
  }
  return (addrinfo *)0x0;
}

Assistant:

struct evutil_addrinfo *
evutil_new_addrinfo_(struct sockaddr *sa, ev_socklen_t socklen,
    const struct evutil_addrinfo *hints)
{
	struct evutil_addrinfo *res;
	EVUTIL_ASSERT(hints);

	if (hints->ai_socktype == 0 && hints->ai_protocol == 0) {
		/* Indecisive user! Give them a UDP and a TCP. */
		struct evutil_addrinfo *r1, *r2;
		struct evutil_addrinfo tmp;
		memcpy(&tmp, hints, sizeof(tmp));
		tmp.ai_socktype = SOCK_STREAM; tmp.ai_protocol = IPPROTO_TCP;
		r1 = evutil_new_addrinfo_(sa, socklen, &tmp);
		if (!r1)
			return NULL;
		tmp.ai_socktype = SOCK_DGRAM; tmp.ai_protocol = IPPROTO_UDP;
		r2 = evutil_new_addrinfo_(sa, socklen, &tmp);
		if (!r2) {
			evutil_freeaddrinfo(r1);
			return NULL;
		}
		r1->ai_next = r2;
		return r1;
	}

	/* We're going to allocate extra space to hold the sockaddr. */
	res = mm_calloc(1,sizeof(struct evutil_addrinfo)+socklen);
	if (!res)
		return NULL;
	res->ai_addr = (struct sockaddr*)
	    (((char*)res) + sizeof(struct evutil_addrinfo));
	memcpy(res->ai_addr, sa, socklen);
	res->ai_addrlen = socklen;
	res->ai_family = sa->sa_family; /* Same or not? XXX */
	res->ai_flags = EVUTIL_AI_LIBEVENT_ALLOCATED;
	res->ai_socktype = hints->ai_socktype;
	res->ai_protocol = hints->ai_protocol;

	return res;
}